

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

void __thiscall
ktx::
Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
::Combine(Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
          *this)

{
  OptionsCreate::OptionsCreate(&this->super_OptionsCreate);
  OptionsEncodeASTC::OptionsEncodeASTC(&this->super_OptionsEncodeASTC);
  OptionsEncodeBasis<false>::OptionsEncodeBasis(&this->super_OptionsEncodeBasis<false>);
  OptionsEncodeCommon::OptionsEncodeCommon(&this->super_OptionsEncodeCommon);
  (this->super_OptionsDeflate).compressOptions._M_dataplus._M_p =
       (pointer)&(this->super_OptionsDeflate).compressOptions.field_2;
  (this->super_OptionsDeflate).compressOptions._M_string_length = 0;
  (this->super_OptionsDeflate).compressOptions.field_2._M_local_buf[0] = '\0';
  (this->super_OptionsDeflate).zstd.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsDeflate).zlib.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsMultiInSingleOut).inputFilepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_OptionsMultiInSingleOut).inputFilepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_OptionsMultiInSingleOut).inputFilepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_OptionsMultiInSingleOut).outputFilepath._M_dataplus._M_p =
       (pointer)&(this->super_OptionsMultiInSingleOut).outputFilepath.field_2;
  (this->super_OptionsMultiInSingleOut).outputFilepath._M_string_length = 0;
  (this->super_OptionsMultiInSingleOut).outputFilepath.field_2._M_local_buf[0] = '\0';
  (this->super_OptionsGeneric).testrun = false;
  return;
}

Assistant:

void init(cxxopts::Options& opts) {
        (Args::init(opts), ...);
    }